

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

void xmlXPathIdFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  xmlXPathObjectPtr pxVar1;
  xmlChar *pxVar2;
  xmlNodeSetPtr pxVar3;
  int local_3c;
  int i;
  xmlNodeSetPtr ns;
  xmlXPathObjectPtr obj;
  xmlNodeSetPtr ret;
  xmlChar *tokens;
  int nargs_local;
  xmlXPathParserContextPtr ctxt_local;
  
  if (ctxt != (xmlXPathParserContextPtr)0x0) {
    if (nargs == 1) {
      if (ctxt->valueNr < 1) {
        xmlXPathErr(ctxt,0x17);
      }
      else {
        pxVar1 = xmlXPathValuePop(ctxt);
        if (pxVar1 == (xmlXPathObjectPtr)0x0) {
          xmlXPathErr(ctxt,10);
        }
        else if ((pxVar1->type == XPATH_NODESET) || (pxVar1->type == XPATH_XSLT_TREE)) {
          obj = (xmlXPathObjectPtr)xmlXPathNodeSetCreate((xmlNodePtr)0x0);
          if (obj == (xmlXPathObjectPtr)0x0) {
            xmlXPathPErrMemory(ctxt);
          }
          if (pxVar1->nodesetval != (xmlNodeSetPtr)0x0) {
            for (local_3c = 0; local_3c < pxVar1->nodesetval->nodeNr; local_3c = local_3c + 1) {
              pxVar2 = xmlXPathCastNodeToString(pxVar1->nodesetval->nodeTab[local_3c]);
              if (pxVar2 == (xmlChar *)0x0) {
                xmlXPathPErrMemory(ctxt);
              }
              pxVar3 = xmlXPathGetElementsByIds(ctxt->context->doc,pxVar2);
              if (pxVar3 == (xmlNodeSetPtr)0x0) {
                xmlXPathPErrMemory(ctxt);
              }
              obj = (xmlXPathObjectPtr)xmlXPathNodeSetMerge((xmlNodeSetPtr)obj,pxVar3);
              if (obj == (xmlXPathObjectPtr)0x0) {
                xmlXPathPErrMemory(ctxt);
              }
              xmlXPathFreeNodeSet(pxVar3);
              if (pxVar2 != (xmlChar *)0x0) {
                (*xmlFree)(pxVar2);
              }
            }
          }
          xmlXPathReleaseObject(ctxt->context,pxVar1);
          pxVar1 = xmlXPathCacheWrapNodeSet(ctxt,(xmlNodeSetPtr)obj);
          xmlXPathValuePush(ctxt,pxVar1);
        }
        else {
          pxVar2 = xmlXPathCastToString(pxVar1);
          if (pxVar2 == (xmlChar *)0x0) {
            xmlXPathPErrMemory(ctxt);
          }
          xmlXPathReleaseObject(ctxt->context,pxVar1);
          pxVar3 = xmlXPathGetElementsByIds(ctxt->context->doc,pxVar2);
          if (pxVar3 == (xmlNodeSetPtr)0x0) {
            xmlXPathPErrMemory(ctxt);
          }
          (*xmlFree)(pxVar2);
          pxVar1 = xmlXPathCacheWrapNodeSet(ctxt,pxVar3);
          xmlXPathValuePush(ctxt,pxVar1);
        }
      }
    }
    else {
      xmlXPathErr(ctxt,0xc);
    }
  }
  return;
}

Assistant:

void
xmlXPathIdFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    xmlChar *tokens;
    xmlNodeSetPtr ret;
    xmlXPathObjectPtr obj;

    CHECK_ARITY(1);
    obj = xmlXPathValuePop(ctxt);
    if (obj == NULL) XP_ERROR(XPATH_INVALID_OPERAND);
    if ((obj->type == XPATH_NODESET) || (obj->type == XPATH_XSLT_TREE)) {
	xmlNodeSetPtr ns;
	int i;

	ret = xmlXPathNodeSetCreate(NULL);
        if (ret == NULL)
            xmlXPathPErrMemory(ctxt);

	if (obj->nodesetval != NULL) {
	    for (i = 0; i < obj->nodesetval->nodeNr; i++) {
		tokens =
		    xmlXPathCastNodeToString(obj->nodesetval->nodeTab[i]);
                if (tokens == NULL)
                    xmlXPathPErrMemory(ctxt);
		ns = xmlXPathGetElementsByIds(ctxt->context->doc, tokens);
                if (ns == NULL)
                    xmlXPathPErrMemory(ctxt);
		ret = xmlXPathNodeSetMerge(ret, ns);
                if (ret == NULL)
                    xmlXPathPErrMemory(ctxt);
		xmlXPathFreeNodeSet(ns);
		if (tokens != NULL)
		    xmlFree(tokens);
	    }
	}
	xmlXPathReleaseObject(ctxt->context, obj);
	xmlXPathValuePush(ctxt, xmlXPathCacheWrapNodeSet(ctxt, ret));
	return;
    }
    tokens = xmlXPathCastToString(obj);
    if (tokens == NULL)
        xmlXPathPErrMemory(ctxt);
    xmlXPathReleaseObject(ctxt->context, obj);
    ret = xmlXPathGetElementsByIds(ctxt->context->doc, tokens);
    if (ret == NULL)
        xmlXPathPErrMemory(ctxt);
    xmlFree(tokens);
    xmlXPathValuePush(ctxt, xmlXPathCacheWrapNodeSet(ctxt, ret));
}